

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  char *pcVar8;
  undefined8 uVar9;
  FILE *pFVar10;
  timeval tVar11;
  undefined8 uStack_200;
  int maxfd;
  int local_1e0;
  int running;
  long timeout;
  char *local_1d0;
  timeval local_1c8;
  int msgs_left;
  fd_set fdwrite;
  fd_set fdread;
  fd_set fdexcep;
  
  local_1d0 = URL;
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar10 = _stderr;
  if (uVar1 != 0) {
    uVar9 = curl_easy_strerror(uVar1);
    fprintf(pFVar10,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
            ,0x3b,(ulong)uVar1,uVar9);
    goto LAB_00102728;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
            ,0x40);
    uVar1 = 0x7c;
LAB_001027cf:
    lVar5 = 0;
  }
  else {
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
              ,0x42);
      uVar1 = 0x7b;
      goto LAB_001027cf;
    }
    iVar3 = 0;
    do {
      if (iVar3 == 2) {
        uVar1 = 0;
        break;
      }
      local_1e0 = iVar3;
      uVar1 = curl_easy_setopt(lVar4,0x29,1);
      pFVar10 = _stderr;
      if (uVar1 != 0) {
        uVar9 = curl_easy_strerror(uVar1);
        fprintf(pFVar10,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                ,0x46,(ulong)uVar1,uVar9);
        break;
      }
      uVar2 = curl_easy_setopt(lVar4,0x2712,local_1d0);
      pFVar10 = _stderr;
      if (uVar2 != 0) {
        uVar9 = curl_easy_strerror(uVar2);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_200 = 0x49;
        goto LAB_0010266d;
      }
      if (local_1e0 != 0) {
        uVar1 = curl_easy_setopt(lVar4,0x8d,0);
        pFVar10 = _stderr;
        if (uVar1 == 0) {
          uVar1 = curl_easy_setopt(lVar4,0x2c,1);
          pFVar10 = _stderr;
          if (uVar1 == 0) {
            uVar1 = curl_easy_setopt(lVar4,0x4b,1);
            pFVar10 = _stderr;
            if (uVar1 == 0) goto LAB_001023b5;
            uVar9 = curl_easy_strerror(uVar1);
            uStack_200 = 0x53;
          }
          else {
            uVar9 = curl_easy_strerror(uVar1);
            uStack_200 = 0x52;
          }
        }
        else {
          uVar9 = curl_easy_strerror(uVar1);
          uStack_200 = 0x51;
        }
LAB_00102927:
        fprintf(pFVar10,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                ,uStack_200,(ulong)uVar1,uVar9);
        break;
      }
      uVar1 = curl_easy_setopt(lVar4,0x8d,1);
      pFVar10 = _stderr;
      if (uVar1 != 0) {
        uVar9 = curl_easy_strerror(uVar1);
        uStack_200 = 0x4d;
        goto LAB_00102927;
      }
LAB_001023b5:
      uVar2 = curl_multi_add_handle(lVar5,lVar4);
      pFVar10 = _stderr;
      if (uVar2 != 0) {
        uVar9 = curl_multi_strerror(uVar2);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_200 = 0x56;
LAB_0010266d:
        fprintf(pFVar10,pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                ,uStack_200,(ulong)uVar2,uVar9);
        uVar1 = uVar2;
        break;
      }
LAB_001023cd:
      timeout = -99;
      maxfd = -99;
      uVar2 = curl_multi_perform(lVar5,&running);
      pFVar10 = _stderr;
      if (uVar2 != 0) {
        uVar9 = curl_multi_strerror(uVar2);
        pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_200 = 0x60;
        goto LAB_0010266d;
      }
      if (running < 0) {
        pcVar8 = 
        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
        uStack_200 = 0x60;
LAB_00102637:
        fprintf(_stderr,pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                ,uStack_200);
        uVar1 = 0x7a;
        break;
      }
      tVar11 = tutil_tvnow();
      lVar6 = tutil_tvdiff(tVar11,tv_test_start);
      if (5000 < lVar6) {
        uStack_200 = 0x62;
        goto LAB_00102702;
      }
      if (running != 0) {
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdread.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdwrite.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdexcep.__fds_bits[lVar6] = 0;
        }
        uVar2 = curl_multi_fdset(lVar5,&fdread,&fdwrite,&fdexcep,&maxfd);
        pFVar10 = _stderr;
        if (uVar2 == 0) {
          if (maxfd < -1) {
            pcVar8 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
            uStack_200 = 0x6b;
            goto LAB_00102637;
          }
          uVar2 = curl_multi_timeout(lVar5,&timeout);
          pFVar10 = _stderr;
          if (uVar2 == 0) {
            if (timeout < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x6f,timeout);
              uVar1 = 0x73;
            }
            else {
              if (timeout == -1) {
                local_1c8.tv_sec = 6;
                local_1c8.tv_usec = 0;
              }
              else {
                local_1c8.tv_sec = (ulong)timeout / 1000;
                local_1c8.tv_usec = ((ulong)timeout % 1000) * 1000;
              }
              iVar3 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&local_1c8);
              if (iVar3 != -1) goto code_r0x0010251f;
              puVar7 = (uint *)__errno_location();
              pFVar10 = _stderr;
              uVar1 = *puVar7;
              pcVar8 = strerror(uVar1);
              fprintf(pFVar10,"%s:%d select() failed, with errno %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x7c,(ulong)uVar1,pcVar8);
              uVar1 = 0x79;
            }
            break;
          }
          uVar9 = curl_multi_strerror(uVar2);
          pcVar8 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
          uStack_200 = 0x6f;
        }
        else {
          uVar9 = curl_multi_strerror(uVar2);
          pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_200 = 0x6b;
        }
        goto LAB_0010266d;
      }
      lVar6 = curl_multi_info_read(lVar5,&msgs_left);
      if (lVar6 == 0) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(uint *)(lVar6 + 0x10);
      }
      uVar2 = curl_multi_remove_handle(lVar5,lVar4);
      pFVar10 = _stderr;
      if (uVar2 != 0) {
        uVar9 = curl_multi_strerror(uVar2);
        pcVar8 = "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n";
        uStack_200 = 0x85;
        goto LAB_0010266d;
      }
      iVar3 = local_1e0 + 1;
    } while (uVar1 == 0);
  }
LAB_00102713:
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
LAB_00102728:
  return uVar1;
code_r0x0010251f:
  tVar11 = tutil_tvnow();
  lVar6 = tutil_tvdiff(tVar11,tv_test_start);
  if (5000 < lVar6) {
    uStack_200 = 0x7e;
LAB_00102702:
    fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
            ,uStack_200);
    uVar1 = 0x7d;
    goto LAB_00102713;
  }
  goto LAB_001023cd;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  easy_init(easy);

  multi_init(multi);

  for (phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if (phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if (phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than -1. */

      if(timeout != -1L) {
        interval.tv_sec = timeout/1000;
        interval.tv_usec = (timeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
        interval.tv_usec = 0;
      }

      select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}